

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O2

void Gia_Sim2ProcessRefined(Gia_Sim2_t *p,Vec_Int_t *vRefined)

{
  Gia_Man_t *p_00;
  ulong uVar1;
  uint uVar2;
  int Id;
  int iVar3;
  Gia_Rpr_t GVar4;
  void *__ptr;
  long lVar5;
  uint uVar6;
  uint nTableSize;
  ulong uVar7;
  int iVar8;
  int iVar9;
  
  iVar9 = vRefined->nSize;
  if (iVar9 == 0) {
    return;
  }
  uVar6 = iVar9 / 3 + 999;
  do {
    do {
      nTableSize = uVar6 + 1;
      uVar2 = uVar6 & 1;
      uVar6 = nTableSize;
    } while (uVar2 != 0);
    uVar7 = 3;
    do {
      iVar8 = (int)uVar7;
      if (nTableSize < (uint)(iVar8 * iVar8)) {
        __ptr = calloc((long)(int)nTableSize,4);
        iVar8 = 0;
        do {
          if (iVar9 <= iVar8) {
            free(__ptr);
            return;
          }
          Id = Vec_IntEntry(vRefined,iVar8);
          iVar3 = Gia_Sim2HashKey(p->pDataSim + p->nWords * Id,p->nWords,nTableSize);
          iVar9 = *(int *)((long)__ptr + (long)iVar3 * 4);
          lVar5 = (long)iVar9;
          p_00 = p->pAig;
          if (lVar5 == 0) {
            GVar4 = p_00->pReprs[Id];
            if (((uint)GVar4 & 0xfffffff) != 0) {
              __assert_fail("Gia_ObjRepr(p->pAig, i) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim2.c"
                            ,0x1e2,"void Gia_Sim2ProcessRefined(Gia_Sim2_t *, Vec_Int_t *)");
            }
            if (p_00->pNexts[Id] != 0) {
              __assert_fail("Gia_ObjNext(p->pAig, i) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim2.c"
                            ,0x1e3,"void Gia_Sim2ProcessRefined(Gia_Sim2_t *, Vec_Int_t *)");
            }
            p_00->pReprs[Id] = (Gia_Rpr_t)((uint)GVar4 | 0xfffffff);
          }
          else {
            p_00->pNexts[lVar5] = Id;
            Gia_ObjSetRepr(p_00,Id,(uint)p_00->pReprs[lVar5] & 0xfffffff);
            GVar4 = p->pAig->pReprs[Id];
            if ((~(uint)GVar4 & 0xfffffff) == 0) {
              Gia_ObjSetRepr(p->pAig,Id,iVar9);
              GVar4 = p->pAig->pReprs[Id];
            }
            if (((uint)GVar4 & 0xfffffff) == 0) {
              __assert_fail("Gia_ObjRepr(p->pAig, i) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim2.c"
                            ,0x1ec,"void Gia_Sim2ProcessRefined(Gia_Sim2_t *, Vec_Int_t *)");
            }
          }
          *(int *)((long)__ptr + (long)iVar3 * 4) = Id;
          iVar8 = iVar8 + 1;
          iVar9 = vRefined->nSize;
        } while( true );
      }
      uVar1 = (ulong)nTableSize % uVar7;
      uVar7 = (ulong)(iVar8 + 2);
    } while ((int)uVar1 != 0);
  } while( true );
}

Assistant:

void Gia_Sim2ProcessRefined( Gia_Sim2_t * p, Vec_Int_t * vRefined )
{
    unsigned * pSim;
    int * pTable, nTableSize, i, k, Key;
    if ( Vec_IntSize(vRefined) == 0 )
        return;
    nTableSize = Abc_PrimeCudd( 1000 + Vec_IntSize(vRefined) / 3 );
    pTable = ABC_CALLOC( int, nTableSize );
    Vec_IntForEachEntry( vRefined, i, k )
    {
        pSim = Gia_Sim2Data( p, i );
        Key = Gia_Sim2HashKey( pSim, p->nWords, nTableSize );
        if ( pTable[Key] == 0 )
        {
            assert( Gia_ObjRepr(p->pAig, i) == 0 );
            assert( Gia_ObjNext(p->pAig, i) == 0 );
            Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
        }
        else
        {
            Gia_ObjSetNext( p->pAig, pTable[Key], i );
            Gia_ObjSetRepr( p->pAig, i, Gia_ObjRepr(p->pAig, pTable[Key]) );
            if ( Gia_ObjRepr(p->pAig, i) == GIA_VOID )
                Gia_ObjSetRepr( p->pAig, i, pTable[Key] );
            assert( Gia_ObjRepr(p->pAig, i) > 0 );
        }
        pTable[Key] = i;
    }
/*
    Vec_IntForEachEntry( vRefined, i, k )
    {
        if ( Gia_ObjIsHead( p->pAig, i ) )
            Gia_Sim2ClassRefineOne( p, i );
    }
*/
    ABC_FREE( pTable );
}